

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O1

void __thiscall
SGParser::Generator::StdGrammarStackElement::SetErrorData
          (StdGrammarStackElement *this,TokenType *t,
          TokenStream<SGParser::Generator::StdGrammarToken> *stream)

{
  size_type *psVar1;
  String *pSVar2;
  long *plVar3;
  long *plVar4;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  undefined4 local_80 [2];
  TokenType tok;
  long local_38 [2];
  
  psVar1 = &tok.Str._M_string_length;
  local_80[0] = 1;
  tok.Str._M_dataplus._M_p = (pointer)0x0;
  tok.Str._M_string_length._0_1_ = 0;
  tok.Str.field_2._8_8_ = 0;
  tok.Line = 0;
  tok._0_8_ = psVar1;
  (*stream->_vptr_TokenStream[2])(stream,local_80);
  if ((this->field_1).pData == (void *)0x0) {
    pSVar2 = (String *)operator_new(0x20);
    (pSVar2->_M_dataplus)._M_p = (pointer)&pSVar2->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pSVar2,tok._0_8_,tok.Str._M_dataplus._M_p + tok._0_8_);
    (this->field_1).pString = pSVar2;
    this->Type = 0x20000000;
    this->Line = tok.Str.field_2._8_8_;
    this->Offset = tok.Line;
    if (this->MaxErrorStrLength < pSVar2->_M_string_length) {
      std::__cxx11::string::substr((ulong)&tok.Offset,(ulong)pSVar2);
      plVar3 = (long *)std::__cxx11::string::append((char *)&tok.Offset);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar3[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar3;
      }
      local_98 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)(this->field_1).pString,(string *)&local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if ((long *)tok.Offset != local_38) {
        operator_delete((void *)tok.Offset,local_38[0] + 1);
      }
    }
    if ((size_type *)tok._0_8_ != psVar1) {
      operator_delete((void *)tok._0_8_,
                      CONCAT71(tok.Str._M_string_length._1_7_,(undefined1)tok.Str._M_string_length)
                      + 1);
    }
    return;
  }
  __assert_fail("pData == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                ,0x1f5,
                "void SGParser::Generator::StdGrammarStackElement::SetErrorData(TokenType &, TokenStream<TokenType> &)"
               );
}

Assistant:

void SetErrorData([[maybe_unused]] TokenType& t, TokenStream<TokenType>& stream) {
        TokenType tok;
        stream.GetNextToken(tok);
        // Get Error token String
        SG_ASSERT(pData == nullptr);
        pString = new String{tok.Str};
        Type    = DataString;
        Line    = tok.Line;
        Offset  = tok.Offset;

        // Shorten the error to MaxErrorStrLength characters and add three dots
        if (pString->size() > MaxErrorStrLength)
            *pString = pString->substr(0u, MaxErrorStrLength) + "...";
    }